

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O2

ArrayRef<double> * __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::InitialValues
          (BasicProblem<mp::BasicProblemParams<int>_> *this)

{
  double *pdVar1;
  ArrayRef<double> *in_RDI;
  
  (in_RDI->save_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->save_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->save_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pdVar1 = (this->initial_values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  in_RDI->data_ = pdVar1;
  in_RDI->size_ =
       (long)(this->initial_values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
  return in_RDI;
}

Assistant:

ArrayRef<double> InitialValues() const { return initial_values_; }